

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIrrCreationParameters.h
# Opt level: O0

void __thiscall
irr::SIrrlichtCreationParameters::SIrrlichtCreationParameters(SIrrlichtCreationParameters *this)

{
  char *in_RDI;
  uint uVar1;
  uint uVar2;
  
  in_RDI[0] = '\x04';
  in_RDI[1] = '\0';
  in_RDI[2] = '\0';
  in_RDI[3] = '\0';
  in_RDI[4] = '\x01';
  in_RDI[5] = '\0';
  in_RDI[6] = '\0';
  in_RDI[7] = '\0';
  uVar2 = 800;
  uVar1 = 600;
  core::dimension2d<unsigned_int>::dimension2d
            ((dimension2d<unsigned_int> *)(in_RDI + 8),(uint *)&stack0xfffffffffffffff4,
             (uint *)&stack0xfffffffffffffff0);
  core::vector2d<int>::vector2d((vector2d<int> *)(in_RDI + 0x10),-1,-1);
  in_RDI[0x18] = ' ';
  in_RDI[0x19] = '\x18';
  in_RDI[0x1a] = '\0';
  in_RDI[0x1b] = '\0';
  in_RDI[0x1c] = '\x02';
  in_RDI[0x1d] = '\x01';
  in_RDI[0x1e] = '\0';
  in_RDI[0x1f] = '\0';
  in_RDI[0x20] = '\0';
  in_RDI[0x21] = '\x01';
  in_RDI[0x22] = '\0';
  in_RDI[0x28] = '\0';
  in_RDI[0x29] = '\0';
  in_RDI[0x2a] = '\0';
  in_RDI[0x2b] = '\0';
  in_RDI[0x2c] = '\0';
  in_RDI[0x2d] = '\0';
  in_RDI[0x2e] = '\0';
  in_RDI[0x2f] = '\0';
  in_RDI[0x30] = '\0';
  in_RDI[0x31] = '\0';
  in_RDI[0x32] = '\0';
  in_RDI[0x33] = '\0';
  in_RDI[0x34] = '\0';
  in_RDI[0x35] = '\0';
  in_RDI[0x36] = '\0';
  in_RDI[0x37] = '\0';
  in_RDI[0x38] = '\x01';
  in_RDI[0x39] = '\0';
  in_RDI[0x3a] = '\0';
  in_RDI[0x3b] = '\0';
  *(char **)(in_RDI + 0x40) = "1.9.0mt15";
  in_RDI[0x48] = '\0';
  in_RDI[0x49] = '\0';
  in_RDI[0x4a] = '\0';
  in_RDI[0x4b] = '\0';
  in_RDI[0x4c] = '\0';
  in_RDI[0x4d] = '\0';
  in_RDI[0x4e] = '\0';
  in_RDI[0x4f] = '\0';
  core::string<char>::string<char>((string<char> *)CONCAT44(uVar2,uVar1),in_RDI);
  return;
}

Assistant:

SIrrlichtCreationParameters() :
			DeviceType(EIDT_BEST),
			DriverType(video::EDT_OPENGL),
			WindowSize(core::dimension2d<u32>(800, 600)),
			WindowPosition(core::position2di(-1, -1)),
			Bits(32),
			ZBufferBits(24),
			Fullscreen(false),
			WindowMaximized(false),
			WindowResizable(2),
			Stencilbuffer(true),
			Vsync(false),
			AntiAlias(0),
			WithAlphaChannel(false),
			Doublebuffer(true),
			Stereobuffer(false),
			EventReceiver(0),
			WindowId(0),
#ifdef _DEBUG
			LoggingLevel(ELL_DEBUG),
#else
			LoggingLevel(ELL_INFORMATION),
#endif
			SDK_version_do_not_use(IRRLICHT_SDK_VERSION),
			PrivateData(0),
#ifdef IRR_MOBILE_PATHS
			OGLES2ShaderPath("media/Shaders/")
#else
			OGLES2ShaderPath("../../media/Shaders/")
#endif
	{
	}